

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O1

Channel * __thiscall
OPL::DOSBox::DBOPL::Channel::BlockTemplate<(OPL::DOSBox::DBOPL::SynthMode)11>
          (Channel *this,Chip *chip,Bit32u samples,Bit32s *output)

{
  byte bVar1;
  byte bVar2;
  Bit32u BVar3;
  ulong uVar4;
  
  bVar1 = chip->tremoloValue;
  this->op[0].currentLevel = (uint)(this->op[0].tremoloMask & bVar1) + this->op[0].totalLevel;
  BVar3 = this->op[0].waveAdd;
  this->op[0].waveCurrent = BVar3;
  bVar2 = chip->vibratoShift;
  if (this->op[0].vibStrength >> (bVar2 & 0x1f) != 0) {
    this->op[0].waveCurrent =
         (BVar3 - (int)chip->vibratoSign) +
         (this->op[0].vibrato >> (bVar2 & 0x1f) ^ (int)chip->vibratoSign);
  }
  this->op[1].currentLevel = (uint)(this->op[1].tremoloMask & bVar1) + this->op[1].totalLevel;
  BVar3 = this->op[1].waveAdd;
  this->op[1].waveCurrent = BVar3;
  if (this->op[1].vibStrength >> (bVar2 & 0x1f) != 0) {
    this->op[1].waveCurrent =
         (BVar3 - (int)chip->vibratoSign) +
         (this->op[1].vibrato >> (bVar2 & 0x1f) ^ (int)chip->vibratoSign);
  }
  this[1].op[0].currentLevel = (uint)(this[1].op[0].tremoloMask & bVar1) + this[1].op[0].totalLevel;
  BVar3 = this[1].op[0].waveAdd;
  this[1].op[0].waveCurrent = BVar3;
  if (this[1].op[0].vibStrength >> (bVar2 & 0x1f) != 0) {
    this[1].op[0].waveCurrent =
         (BVar3 - (int)chip->vibratoSign) +
         (this[1].op[0].vibrato >> (bVar2 & 0x1f) ^ (int)chip->vibratoSign);
  }
  this[1].op[1].currentLevel = (uint)(this[1].op[1].tremoloMask & bVar1) + this[1].op[1].totalLevel;
  BVar3 = this[1].op[1].waveAdd;
  this[1].op[1].waveCurrent = BVar3;
  if (this[1].op[1].vibStrength >> (bVar2 & 0x1f) != 0) {
    this[1].op[1].waveCurrent =
         (BVar3 - (int)chip->vibratoSign) +
         (this[1].op[1].vibrato >> (bVar2 & 0x1f) ^ (int)chip->vibratoSign);
  }
  this[2].op[0].currentLevel = (uint)(this[2].op[0].tremoloMask & bVar1) + this[2].op[0].totalLevel;
  BVar3 = this[2].op[0].waveAdd;
  this[2].op[0].waveCurrent = BVar3;
  if (this[2].op[0].vibStrength >> (bVar2 & 0x1f) != 0) {
    this[2].op[0].waveCurrent =
         (BVar3 - (int)chip->vibratoSign) +
         (this[2].op[0].vibrato >> (bVar2 & 0x1f) ^ (int)chip->vibratoSign);
  }
  this[2].op[1].currentLevel = (uint)(this[2].op[1].tremoloMask & bVar1) + this[2].op[1].totalLevel;
  BVar3 = this[2].op[1].waveAdd;
  this[2].op[1].waveCurrent = BVar3;
  if (this[2].op[1].vibStrength >> (bVar2 & 0x1f) != 0) {
    this[2].op[1].waveCurrent =
         (BVar3 - (int)chip->vibratoSign) +
         (this[2].op[1].vibrato >> (bVar2 & 0x1f) ^ (int)chip->vibratoSign);
  }
  if (samples != 0) {
    uVar4 = 0;
    do {
      GeneratePercussion<true>(this,chip,output + (uVar4 & 0xffffffff));
      uVar4 = uVar4 + 2;
    } while ((ulong)samples * 2 != uVar4);
  }
  return this + 3;
}

Assistant:

Channel* Channel::BlockTemplate( Chip* chip, Bit32u samples, Bit32s* output ) {
	switch( mode ) {
	case sm2AM:
	case sm3AM:
		if ( Op(0)->Silent() && Op(1)->Silent() ) {
			old[0] = old[1] = 0;
			return (this + 1);
		}
		break;
	case sm2FM:
	case sm3FM:
		if ( Op(1)->Silent() ) {
			old[0] = old[1] = 0;
			return (this + 1);
		}
		break;
	case sm3FMFM:
		if ( Op(3)->Silent() ) {
			old[0] = old[1] = 0;
			return (this + 2);
		}
		break;
	case sm3AMFM:
		if ( Op(0)->Silent() && Op(3)->Silent() ) {
			old[0] = old[1] = 0;
			return (this + 2);
		}
		break;
	case sm3FMAM:
		if ( Op(1)->Silent() && Op(3)->Silent() ) {
			old[0] = old[1] = 0;
			return (this + 2);
		}
		break;
	case sm3AMAM:
		if ( Op(0)->Silent() && Op(2)->Silent() && Op(3)->Silent() ) {
			old[0] = old[1] = 0;
			return (this + 2);
		}
		break;
	case sm2Percussion:
		// This case was not handled in the DOSBox code either
		// thus we leave this blank.
		// TODO: Consider checking this.
		break;
	case sm3Percussion:
		// This case was not handled in the DOSBox code either
		// thus we leave this blank.
		// TODO: Consider checking this.
		break;
	case sm4Start:
		// This case was not handled in the DOSBox code either
		// thus we leave this blank.
		// TODO: Consider checking this.
		break;
	case sm6Start:
		// This case was not handled in the DOSBox code either
		// thus we leave this blank.
		// TODO: Consider checking this.
		break;
	}
	//Init the operators with the the current vibrato and tremolo values
	Op( 0 )->Prepare( chip );
	Op( 1 )->Prepare( chip );
	if ( mode > sm4Start ) {
		Op( 2 )->Prepare( chip );
		Op( 3 )->Prepare( chip );
	}
	if ( mode > sm6Start ) {
		Op( 4 )->Prepare( chip );
		Op( 5 )->Prepare( chip );
	}
	for ( Bitu i = 0; i < samples; i++ ) {
		//Early out for percussion handlers
		if ( mode == sm2Percussion ) {
			GeneratePercussion<false>( chip, output + i );
			continue;	//Prevent some unitialized value bitching
		} else if ( mode == sm3Percussion ) {
			GeneratePercussion<true>( chip, output + i * 2 );
			continue;	//Prevent some unitialized value bitching
		}

		//Do unsigned shift so we can shift out all bits but still stay in 10 bit range otherwise
		Bit32s mod = (Bit32u)((old[0] + old[1])) >> feedback;
		old[0] = old[1];
		old[1] = Op(0)->GetSample( mod );
		Bit32s sample;
		Bit32s out0 = old[0];
		if ( mode == sm2AM || mode == sm3AM ) {
			sample = out0 + Op(1)->GetSample( 0 );
		} else if ( mode == sm2FM || mode == sm3FM ) {
			sample = Op(1)->GetSample( out0 );
		} else if ( mode == sm3FMFM ) {
			Bits next = Op(1)->GetSample( out0 );
			next = Op(2)->GetSample( next );
			sample = Op(3)->GetSample( next );
		} else if ( mode == sm3AMFM ) {
			sample = out0;
			Bits next = Op(1)->GetSample( 0 );
			next = Op(2)->GetSample( next );
			sample += Op(3)->GetSample( next );
		} else if ( mode == sm3FMAM ) {
			sample = Op(1)->GetSample( out0 );
			Bits next = Op(2)->GetSample( 0 );
			sample += Op(3)->GetSample( next );
		} else if ( mode == sm3AMAM ) {
			sample = out0;
			Bits next = Op(1)->GetSample( 0 );
			sample += Op(2)->GetSample( next );
			sample += Op(3)->GetSample( 0 );
		}
		switch( mode ) {
		case sm2AM:
		case sm2FM:
			output[ i ] += sample;
			break;
		case sm3AM:
		case sm3FM:
		case sm3FMFM:
		case sm3AMFM:
		case sm3FMAM:
		case sm3AMAM:
			output[ i * 2 + 0 ] += sample & maskLeft;
			output[ i * 2 + 1 ] += sample & maskRight;
			break;
		case sm2Percussion:
			// This case was not handled in the DOSBox code either
			// thus we leave this blank.
			// TODO: Consider checking this.
			break;
		case sm3Percussion:
			// This case was not handled in the DOSBox code either
			// thus we leave this blank.
			// TODO: Consider checking this.
			break;
		case sm4Start:
			// This case was not handled in the DOSBox code either
			// thus we leave this blank.
			// TODO: Consider checking this.
			break;
		case sm6Start:
			// This case was not handled in the DOSBox code either
			// thus we leave this blank.
			// TODO: Consider checking this.
			break;
		}
	}
	switch( mode ) {
	case sm2AM:
	case sm2FM:
	case sm3AM:
	case sm3FM:
		return ( this + 1 );
	case sm3FMFM:
	case sm3AMFM:
	case sm3FMAM:
	case sm3AMAM:
		return( this + 2 );
	case sm2Percussion:
	case sm3Percussion:
		return( this + 3 );
	case sm4Start:
		// This case was not handled in the DOSBox code either
		// thus we leave this blank.
		// TODO: Consider checking this.
		break;
	case sm6Start:
		// This case was not handled in the DOSBox code either
		// thus we leave this blank.
		// TODO: Consider checking this.
		break;
	}
	return 0;
}